

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::update_b(OjaNewton *this)

{
  int i;
  float tmp;
  int j;
  OjaNewton *this_local;
  
  for (j = 1; j <= this->m; j = j + 1) {
    tmp = 0.0;
    for (i = j; i <= this->m; i = i + 1) {
      tmp = (this->ev[i] * (this->data).AZx[i] * this->A[i][j]) /
            (this->alpha * (this->alpha + this->ev[i])) + tmp;
    }
    this->b[j] = tmp * (this->data).g + this->b[j];
  }
  return;
}

Assistant:

void update_b()
  {
    for (int j = 1; j <= m; j++)
    {
      float tmp = 0;
      for (int i = j; i <= m; i++)
      {
        tmp += ev[i] * data.AZx[i] * A[i][j] / (alpha * (alpha + ev[i]));
      }
      b[j] += tmp * data.g;
    }
  }